

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.h
# Opt level: O0

bool __thiscall Js::SimpleTypeHandler<2UL>::SupportsPrototypeInstances(SimpleTypeHandler<2UL> *this)

{
  bool bVar1;
  undefined1 local_21;
  undefined1 local_11;
  SimpleTypeHandler<2UL> *this_local;
  
  bVar1 = DynamicTypeHandler::ChangeTypeOnProto();
  local_11 = 0;
  if (!bVar1) {
    bVar1 = DynamicTypeHandler::GetIsOrMayBecomeShared(&this->super_DynamicTypeHandler);
    local_21 = false;
    if (bVar1) {
      local_21 = DynamicTypeHandler::IsolatePrototypes();
    }
    local_11 = local_21 ^ 0xff;
  }
  return (bool)(local_11 & 1);
}

Assistant:

virtual bool SupportsPrototypeInstances() const { return !ChangeTypeOnProto() && !(GetIsOrMayBecomeShared() && IsolatePrototypes()); }